

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O2

Person * __thiscall hiberlite::real_bean<Person>::get(real_bean<Person> *this)

{
  Person *pPVar1;
  runtime_error *this_00;
  
  if (this->forgotten == false) {
    loadLazy(this);
    pPVar1 = this->obj;
    if (pPVar1 == (Person *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"NULL pointer exception!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pPVar1 = (Person *)0x0;
  }
  return pPVar1;
}

Assistant:

C* real_bean<C>::get()
{
	if(forgotten)
		return NULL;
	loadLazy();
	if(!obj)
		throw std::runtime_error("NULL pointer exception!");
	return obj;
}